

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FundamentalOperationalData.cpp
# Opt level: O1

bool __thiscall
DIS::FundamentalOperationalData::operator==
          (FundamentalOperationalData *this,FundamentalOperationalData *rhs)

{
  return (((this->_dataField2 == rhs->_dataField2 &&
           this->_informationLayers == rhs->_informationLayers) &&
          this->_dataField1 == rhs->_dataField1) && this->_systemStatus == rhs->_systemStatus) &&
         ((((this->_parameter6 == rhs->_parameter6 && rhs->_parameter5 == this->_parameter5) &&
           (rhs->_parameter4 == this->_parameter4 && rhs->_parameter3 == this->_parameter3)) &&
          rhs->_parameter2 == this->_parameter2) && rhs->_parameter1 == this->_parameter1);
}

Assistant:

bool FundamentalOperationalData::operator ==(const FundamentalOperationalData& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_systemStatus == rhs._systemStatus) ) ivarsEqual = false;
     if( ! (_dataField1 == rhs._dataField1) ) ivarsEqual = false;
     if( ! (_informationLayers == rhs._informationLayers) ) ivarsEqual = false;
     if( ! (_dataField2 == rhs._dataField2) ) ivarsEqual = false;
     if( ! (_parameter1 == rhs._parameter1) ) ivarsEqual = false;
     if( ! (_parameter2 == rhs._parameter2) ) ivarsEqual = false;
     if( ! (_parameter3 == rhs._parameter3) ) ivarsEqual = false;
     if( ! (_parameter4 == rhs._parameter4) ) ivarsEqual = false;
     if( ! (_parameter5 == rhs._parameter5) ) ivarsEqual = false;
     if( ! (_parameter6 == rhs._parameter6) ) ivarsEqual = false;

    return ivarsEqual;
 }